

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testNativeFormat.cpp
# Opt level: O2

void testNativeFormat(string *tempDir)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "Testing if uncompressible pixel data are written in Xdr, not native format"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"image 1:");
  std::endl<char,std::char_traits<char>>(poVar1);
  anon_unknown.dwarf_1e0c65::readCopyRead
            (tempDir,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/test_native1.exr"
             ,0xd4a3);
  poVar1 = std::operator<<((ostream *)&std::cout,"image 2:");
  std::endl<char,std::char_traits<char>>(poVar1);
  anon_unknown.dwarf_1e0c65::readCopyRead
            (tempDir,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/test_native2.exr"
             ,0x9307);
  poVar1 = std::operator<<((ostream *)&std::cout,"ok\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void
testNativeFormat (const std::string &tempDir)
{
    try
    {
        cout << "Testing if uncompressible pixel data are written "
		"in Xdr, not native format" << endl;

        cout << "image 1:" << endl;
        readCopyRead(tempDir, ILM_IMF_TEST_IMAGEDIR "test_native1.exr", 54435);
        
        cout << "image 2:" << endl;
        readCopyRead(tempDir, ILM_IMF_TEST_IMAGEDIR "test_native2.exr", 37639);
        
	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
        cerr << "ERROR -- caught exception: " << e.what() << endl;
        assert (false);
    }
}